

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_d021dd::HandleTest
               (cmTest *test,string *propertyName,string *propertyValue,bool appendAsString,
               bool appendMode,bool remove)

{
  bool remove_local;
  bool appendMode_local;
  bool appendAsString_local;
  string *propertyValue_local;
  string *propertyName_local;
  cmTest *test_local;
  
  if (appendMode) {
    cmTest::AppendProperty(test,propertyName,propertyValue,appendAsString);
  }
  else if (remove) {
    cmTest::SetProperty(test,propertyName,(char *)0x0);
  }
  else {
    cmTest::SetProperty(test,propertyName,propertyValue);
  }
  return true;
}

Assistant:

bool HandleTest(cmTest* test, const std::string& propertyName,
                const std::string& propertyValue, bool appendAsString,
                bool appendMode, bool remove)
{
  // Set or append the property.
  if (appendMode) {
    test->AppendProperty(propertyName, propertyValue, appendAsString);
  } else {
    if (remove) {
      test->SetProperty(propertyName, nullptr);
    } else {
      test->SetProperty(propertyName, propertyValue);
    }
  }

  return true;
}